

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_CCtx_refPrefix(ZSTD_CCtx *cctx,void *prefix,size_t prefixSize)

{
  size_t sVar1;
  size_t in_RDX;
  void *in_RSI;
  ZSTD_CCtx *in_RDI;
  
  sVar1 = ZSTD_CCtx_refPrefix_advanced(in_RDI,in_RSI,in_RDX,ZSTD_dct_auto);
  return sVar1;
}

Assistant:

size_t ZSTD_CCtx_refPrefix(ZSTD_CCtx* cctx, const void* prefix, size_t prefixSize)
{
    return ZSTD_CCtx_refPrefix_advanced(cctx, prefix, prefixSize, ZSTD_dct_rawContent);
}